

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O0

void STAT_ChangeLevel(char *newl)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  level_info_t *this;
  char *pcVar5;
  MapData *this_00;
  FStatistics *stats;
  OneLevel *pOVar6;
  FSessionStatistics *es_00;
  char *text;
  FString local_b0;
  FString lsection;
  uint i_1;
  FSessionStatistics *es;
  uint i;
  int validlevels;
  FString infostring;
  int statvals [4];
  FStatistics *sl;
  char *ep_name;
  FString local_58;
  FString local_50;
  FString local_48;
  FString section;
  char *name;
  MapData *map;
  int wad;
  level_info_t *l;
  level_info_t *nextinfo;
  level_info_t *thisinfo;
  char *newl_local;
  
  StoreLevelStats();
  l = (level_info_t *)0x0;
  iVar2 = strncmp(newl,"enDSeQ",6);
  if (iVar2 != 0) {
    this = FindLevelInfo(newl,true);
    l = level_info_t::CheckLevelRedirect(this);
    if (l == (level_info_t *)0x0) {
      l = this;
    }
  }
  iVar2 = FIntCVar::operator_cast_to_int(&savestatistics);
  if (iVar2 == 1) {
    if (((l == (level_info_t *)0x0) || ((l->flags2 & 0x20000000) != 0)) &&
       (StartEpisode != (FEpisode *)0x0)) {
      map._4_4_ = 0;
      pcVar5 = FString::operator_cast_to_char_(&StartEpisode->mEpisodeMap);
      this_00 = P_OpenMapData(pcVar5,false);
      if ((this_00 != (MapData *)0x0) &&
         (map._4_4_ = FWadCollection::GetLumpFile(&Wads,this_00->lumpnum), this_00 != (MapData *)0x0
         )) {
        MapData::~MapData(this_00);
        operator_delete(this_00,0xe8);
      }
      section.Chars = FWadCollection::GetWadName(&Wads,map._4_4_);
      ExtractFileBase((char *)&local_58,SUB81(section.Chars,0));
      FString::operator+(&local_50,(char *)&local_58);
      FString::operator+(&local_48,&local_50);
      FString::~FString(&local_50);
      FString::~FString(&local_58);
      FString::ToUpper(&local_48);
      sl = (FStatistics *)FString::operator_cast_to_char_(&StartEpisode->mEpisodeName);
      if (*(char *)&(sl->stats).Array == '$') {
        sl = (FStatistics *)
             FStringTable::operator[](&GStrings,(char *)((long)&(sl->stats).Array + 1));
      }
      pcVar5 = FString::operator_cast_to_char_(&local_48);
      stats = GetStatisticsList(&EpisodeStatistics,pcVar5,(char *)sl);
      infostring.Chars = (char *)0x0;
      statvals[0] = 0;
      statvals[1] = 0;
      FString::FString((FString *)&i);
      uVar3 = TArray<OneLevel,_OneLevel>::Size(&LevelData);
      es._0_4_ = 0;
      while( true ) {
        uVar4 = TArray<OneLevel,_OneLevel>::Size(&LevelData);
        if (uVar4 <= (uint)es) break;
        pOVar6 = TArray<OneLevel,_OneLevel>::operator[](&LevelData,(ulong)(uint)es);
        infostring.Chars._0_4_ = (int)infostring.Chars + pOVar6->killcount;
        pOVar6 = TArray<OneLevel,_OneLevel>::operator[](&LevelData,(ulong)(uint)es);
        infostring.Chars._4_4_ = infostring.Chars._4_4_ + pOVar6->totalkills;
        pOVar6 = TArray<OneLevel,_OneLevel>::operator[](&LevelData,(ulong)(uint)es);
        iVar2 = pOVar6->secretcount;
        pOVar6 = TArray<OneLevel,_OneLevel>::operator[](&LevelData,(ulong)(uint)es);
        statvals[1] = pOVar6->totalsecrets + statvals[1];
        statvals[0] = statvals[0] + iVar2;
        es._0_4_ = (uint)es + 1;
      }
      FString::Format((FString *)&i,"%4d/%4d, %3d/%3d, %2d",(ulong)infostring.Chars & 0xffffffff,
                      (ulong)infostring.Chars >> 0x20,statvals._0_8_ & 0xffffffff,
                      (ulong)(uint)statvals[1],uVar3);
      pcVar5 = FString::operator_cast_to_char_((FString *)&i);
      iVar2 = AdjustTics(level.totaltime);
      es_00 = StatisticsEntry(stats,pcVar5,iVar2);
      for (lsection.Chars._4_4_ = 0; uVar3 = lsection.Chars._4_4_,
          uVar4 = TArray<OneLevel,_OneLevel>::Size(&LevelData), uVar3 < uVar4;
          lsection.Chars._4_4_ = lsection.Chars._4_4_ + 1) {
        pOVar6 = TArray<OneLevel,_OneLevel>::operator[](&LevelData,(ulong)lsection.Chars._4_4_);
        FString::FString(&local_b0,&pOVar6->Levelname);
        FString::ToUpper(&local_b0);
        pOVar6 = TArray<OneLevel,_OneLevel>::operator[](&LevelData,(ulong)lsection.Chars._4_4_);
        uVar3 = pOVar6->killcount;
        pOVar6 = TArray<OneLevel,_OneLevel>::operator[](&LevelData,(ulong)lsection.Chars._4_4_);
        uVar4 = pOVar6->totalkills;
        pOVar6 = TArray<OneLevel,_OneLevel>::operator[](&LevelData,(ulong)lsection.Chars._4_4_);
        uVar1 = pOVar6->secretcount;
        pOVar6 = TArray<OneLevel,_OneLevel>::operator[](&LevelData,(ulong)lsection.Chars._4_4_);
        FString::Format((FString *)&i,"%4d/%4d, %3d/%3d",(ulong)uVar3,(ulong)uVar4,(ulong)uVar1,
                        (ulong)(uint)pOVar6->totalsecrets);
        pcVar5 = FString::operator_cast_to_char_(&local_b0);
        text = FString::operator_cast_to_char_((FString *)&i);
        pOVar6 = TArray<OneLevel,_OneLevel>::operator[](&LevelData,(ulong)lsection.Chars._4_4_);
        LevelStatEntry(es_00,pcVar5,text,pOVar6->leveltime);
        FString::~FString(&local_b0);
      }
      pcVar5 = FStringCVar::operator_cast_to_char_(&statfile);
      SaveStatistics(pcVar5,&EpisodeStatistics);
      FString::~FString((FString *)&i);
      FString::~FString(&local_48);
    }
  }
  else {
    FIntCVar::operator_cast_to_int(&savestatistics);
  }
  return;
}

Assistant:

void STAT_ChangeLevel(const char *newl)
{
	// record the current level's stats.
	StoreLevelStats();

	level_info_t *thisinfo = level.info;
	level_info_t *nextinfo = NULL;
	
	if (strncmp(newl, "enDSeQ", 6))
	{
		level_info_t *l = FindLevelInfo (newl);
		nextinfo = l->CheckLevelRedirect ();
		if (nextinfo == NULL) nextinfo = l;
	}

	if (savestatistics == 1)
	{
		if ((nextinfo == NULL || (nextinfo->flags2 & LEVEL2_ENDGAME)) && StartEpisode != NULL)
		{
			// we reached the end of this episode
			int wad = 0;
			MapData * map = P_OpenMapData(StartEpisode->mEpisodeMap, false);
			if (map != NULL)
			{
				wad = Wads.GetLumpFile(map->lumpnum);
				delete map;
			}
			const char * name = Wads.GetWadName(wad);
			FString section = ExtractFileBase(name) + "." + StartEpisode->mEpisodeMap;
			section.ToUpper();

			const char *ep_name = StartEpisode->mEpisodeName;
			if (*ep_name == '$') ep_name = GStrings[ep_name+1];
			FStatistics *sl = GetStatisticsList(EpisodeStatistics, section, ep_name);

			int statvals[4] = {0,0,0,0};
			FString infostring;
			int validlevels = LevelData.Size();
			for(unsigned i = 0; i < LevelData.Size(); i++)
			{
				statvals[0] += LevelData[i].killcount;
				statvals[1] += LevelData[i].totalkills;
				statvals[2] += LevelData[i].secretcount;
				statvals[3] += LevelData[i].totalsecrets;
			}

			infostring.Format("%4d/%4d, %3d/%3d, %2d", statvals[0], statvals[1], statvals[2], statvals[3], validlevels);
			FSessionStatistics *es = StatisticsEntry(sl, infostring, AdjustTics(level.totaltime));

			for(unsigned i = 0; i < LevelData.Size(); i++)
			{
				FString lsection = LevelData[i].Levelname;
				lsection.ToUpper();
				infostring.Format("%4d/%4d, %3d/%3d",
					 LevelData[i].killcount, LevelData[i].totalkills, LevelData[i].secretcount, LevelData[i].totalsecrets);

				LevelStatEntry(es, lsection, infostring, LevelData[i].leveltime);
			}
			SaveStatistics(statfile, EpisodeStatistics);
		}
	}
	else if (savestatistics == 2)	// todo: handle single level statistics.
	{
	}
}